

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveXML.h
# Opt level: O3

void __thiscall
chrono::ChArchiveInXML::ChArchiveInXML(ChArchiveInXML *this,ChStreamInAsciiFile *mistream)

{
  char *pcVar1;
  vector<char,_std::allocator<char>_> *this_00;
  pointer *ppcVar2;
  xml_document<char> *this_01;
  iterator *piVar3;
  iterator __position;
  _Elt_pointer ppxVar4;
  _Elt_pointer pbVar5;
  deque<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_> *pdVar6;
  _Deque_base<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_> *p_Var7;
  _Deque_base<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_> *p_Var8;
  ChExceptionArchive *this_02;
  undefined1 auVar10 [32];
  undefined1 auVar9 [64];
  undefined1 auVar11 [32];
  string line;
  bool local_110 [160];
  string local_70 [2];
  
  ChArchiveIn::ChArchiveIn(&this->super_ChArchiveIn);
  pcVar1 = (this->document).super_memory_pool<char>.m_static_memory;
  (this->super_ChArchiveIn).super_ChArchive._vptr_ChArchive =
       (_func_int **)&PTR__ChArchiveInXML_00159598;
  (this->document).super_xml_node<char>.super_xml_base<char>.m_parent = (xml_node<char> *)0x0;
  (this->document).super_xml_node<char>.super_xml_base<char>.m_name = (char *)0x0;
  (this->document).super_xml_node<char>.super_xml_base<char>.m_value = (char *)0x0;
  (this->document).super_xml_node<char>.m_type = node_document;
  (this->document).super_xml_node<char>.m_first_node = (xml_node<char> *)0x0;
  (this->document).super_xml_node<char>.m_first_attribute = (xml_attribute<char> *)0x0;
  (this->document).super_memory_pool<char>.m_alloc_func = (alloc_func *)0x0;
  (this->document).super_memory_pool<char>.m_free_func = (free_func *)0x0;
  auVar9 = ZEXT464(0) << 0x40;
  (this->document).super_memory_pool<char>.m_begin = pcVar1;
  (this->document).super_memory_pool<char>.m_ptr = pcVar1;
  (this->document).super_memory_pool<char>.m_end =
       (char *)&(this->document).super_memory_pool<char>.m_alloc_func;
  pdVar6 = &(this->levels).c;
  auVar10 = auVar9._16_32_;
  p_Var7 = &pdVar6->
            super__Deque_base<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_>
  ;
  (pdVar6->
  super__Deque_base<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_>).
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)auVar9._0_8_;
  (pdVar6->
  super__Deque_base<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_>).
  _M_impl.super__Deque_impl_data._M_map_size = auVar9._8_8_;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)auVar10._0_8_;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)auVar10._8_8_;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)auVar10._16_8_;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)auVar10._24_8_;
  (pdVar6->
  super__Deque_base<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_>).
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)auVar9._48_8_;
  (pdVar6->
  super__Deque_base<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_>).
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)auVar9._56_8_;
  pdVar6 = &(this->levels).c;
  auVar10 = auVar9._0_32_;
  auVar11 = auVar9._32_32_;
  p_Var7 = &pdVar6->
            super__Deque_base<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_>
  ;
  p_Var8 = &pdVar6->
            super__Deque_base<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_>
  ;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)auVar10._0_8_;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)auVar10._8_8_;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)auVar10._16_8_;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)auVar10._24_8_;
  (p_Var8->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)auVar11._0_8_;
  (p_Var8->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)auVar11._8_8_;
  (p_Var8->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)auVar11._16_8_;
  (p_Var8->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)auVar11._24_8_;
  std::_Deque_base<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_>::
  _M_initialize_map((_Deque_base<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_>
                     *)&this->levels,0);
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<bool,_std::allocator<bool>_>::_M_initialize_map
            ((_Deque_base<bool,_std::allocator<bool>_> *)&this->is_array,0);
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->array_index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)&this->array_index,0);
  (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = &this->buffer;
  (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->istream = mistream;
  std::vector<char,std::allocator<char>>::
  _M_assign_aux<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((vector<char,std::allocator<char>> *)this_00,
             *(undefined8 *)(mistream + *(long *)(*(long *)(mistream + 8) + -0x18) + 0xf0),
             0xffffffff,0,0xffffffff);
  local_110[0] = false;
  __position._M_current =
       (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>(this_00,__position,local_110);
  }
  else {
    *__position._M_current = '\0';
    ppcVar2 = &(this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar2 = *ppcVar2 + 1;
  }
  this_01 = &this->document;
  rapidxml::xml_document<char>::parse<0>
            (this_01,(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start);
  if ((this->document).super_xml_node<char>.m_first_node != (xml_node<char> *)0x0) {
    this->level = &this_01->super_xml_node<char>;
    ppxVar4 = (this->levels).c.
              super__Deque_base<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppxVar4 ==
        (this->levels).c.
        super__Deque_base<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<rapidxml::xml_node<char>*,std::allocator<rapidxml::xml_node<char>*>>::
      _M_push_back_aux<rapidxml::xml_node<char>*const&>
                ((deque<rapidxml::xml_node<char>*,std::allocator<rapidxml::xml_node<char>*>> *)
                 &this->levels,&this->level);
    }
    else {
      *ppxVar4 = &this_01->super_xml_node<char>;
      piVar3 = &(this->levels).c.
                super__Deque_base<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar3->_M_cur = piVar3->_M_cur + 1;
    }
    local_110[0] = false;
    pbVar5 = (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pbVar5 == (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<bool,_std::allocator<bool>_>::_M_push_back_aux<bool>(&(this->is_array).c,local_110)
      ;
    }
    else {
      *pbVar5 = false;
      (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = pbVar5 + 1;
    }
    this->tolerate_missing_tokens = false;
    return;
  }
  this_02 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
  local_70[0]._M_dataplus._M_p = (pointer)&local_70[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"The file is not a valid XML document","");
  ChExceptionArchive::ChExceptionArchive(this_02,local_70);
  __cxa_throw(this_02,&ChExceptionArchive::typeinfo,ChException::~ChException);
}

Assistant:

ChArchiveInXML( ChStreamInAsciiFile& mistream) {
            istream = &mistream;

			buffer.assign((std::istreambuf_iterator<char>(istream->GetFstream())), std::istreambuf_iterator<char>());
			buffer.push_back('\0');

			try {
				document.parse<0>(&buffer[0]);
			}
			catch (const rapidxml::parse_error &merror) {
				std::string line(merror.where<char>());
				line.erase(std::find_if(line.begin(), line.end(), [](int c) {return (c==*"\n");}), line.end());
				throw ChExceptionArchive(std::string("XML parsing error: ") + merror.what() + " at: \n" + line + "\n");
			}

			if (!document.first_node())
				throw (ChExceptionArchive("The file is not a valid XML document"));

			level = &document;//.first_node();
            levels.push(level);
            is_array.push(false);

            tolerate_missing_tokens = false;
      }